

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerMandelbrotCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerMandelbrotCase *this,
          int measurementNdx)

{
  deUint32 cacheAvoidanceID;
  deUint32 id;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_1d8;
  Vec4 local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string nameSpec;
  Vector<float,_16> local_160;
  Array<float,_16> local_120;
  UniformSpec local_e0;
  Vec4 local_78;
  undefined1 local_68 [16];
  pointer local_58;
  
  cacheAvoidanceID =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_(&nameSpec,(Performance *)(ulong)cacheAvoidanceID,id);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mandelbrotVertexTemplate_abi_cxx11_();
  specializeShaderSource(&local_e0.name,(string *)&local_160,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_160);
  mandelbrotFragmentTemplate_abi_cxx11_(0);
  specializeShaderSource(&local_e0.name,(string *)&local_160,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_160);
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                 "a_vertex",&nameSpec);
  local_1a8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_1a8._M_string_length = 0x3f80000000000000;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 1.0;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  combineVec4ToVec16(&local_160,(Vec4 *)&local_1a8,(Vec4 *)&local_1d8,&local_1b8,&local_78);
  ShaderCompilerCase::AttribSpec::AttribSpec
            ((AttribSpec *)&local_e0,(string *)&local_120,&local_160);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_68,(AttribSpec *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                 "a_coord",&nameSpec);
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0x3f80000000000000;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 1.0;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  combineVec4ToVec16(&local_160,(Vec4 *)&local_1a8,(Vec4 *)&local_1d8,&local_1b8,&local_78);
  ShaderCompilerCase::AttribSpec::AttribSpec
            ((AttribSpec *)&local_e0,(string *)&local_120,&local_160);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_68,(AttribSpec *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->vertexAttributes,
                   (vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                    *)local_68);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_68);
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_1a8,"u_mvp",&nameSpec);
  local_1b8.m_data[0] = 1.0;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_68,local_1b8.m_data);
  tcu::Matrix<float,_4,_4>::getColumnMajorData(&local_120,(Matrix<float,_4,_4> *)local_68);
  arrTo16<16>(&local_160,&local_120);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_e0,&local_1a8,TYPE_MAT4,&local_160);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>(&local_1d8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->uniforms,&local_1d8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_1d8);
  std::__cxx11::string::~string((string *)&nameSpec);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerMandelbrotCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource = specializeShaderSource(mandelbrotVertexTemplate(), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource = specializeShaderSource(mandelbrotFragmentTemplate(m_numFractalIterations), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes = mandelbrotShaderAttributes(nameSpec);
	result.uniforms = mandelbrotShaderUniforms(nameSpec);

	return result;
}